

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool BackwardPass::UpdateImplicitCallBailOutKind
               (Instr *instr,bool needsBailOutOnImplicitCall,bool needsLazyBailOut)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  BailOutInfo *pBVar6;
  BailOutKind newBailOutKind;
  BailOutKind bailOutKindWithoutBits;
  byte local_1a;
  bool hasMarkTempObject;
  BailOutKind bailOutKindWithBits;
  bool needsLazyBailOut_local;
  bool needsBailOutOnImplicitCall_local;
  Instr *instr_local;
  
  local_1a = needsLazyBailOut;
  hasMarkTempObject = needsBailOutOnImplicitCall;
  _bailOutKindWithBits = instr;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x9b5,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IR::Instr::HasBailOutInfo(_bailOutKindWithBits);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x9b6,"(instr->HasBailOutInfo())","instr->HasBailOutInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  BVar3 = IR::Instr::GetBailOutKind(_bailOutKindWithBits);
  bVar2 = BailOutInfo::IsBailOutOnImplicitCalls(BVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x9b7,"(BailOutInfo::IsBailOutOnImplicitCalls(instr->GetBailOutKind()))",
                       "BailOutInfo::IsBailOutOnImplicitCalls(instr->GetBailOutKind())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((local_1a & 1) == 0) {
    BVar3 = IR::Instr::GetBailOutKind(_bailOutKindWithBits);
    BVar4 = IR::Instr::GetBailOutKind(_bailOutKindWithBits);
    BVar4 = BailOutInfo::WithoutLazyBailOut(BVar4);
    if (BVar3 != BVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x9bb,
                         "(needsLazyBailOut || instr->GetBailOutKind() == BailOutInfo::WithoutLazyBailOut(instr->GetBailOutKind()))"
                         ,
                         "We should have removed all lazy bailout bit at this point if we decided that we wouldn\'t need it"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  if ((local_1a & 1) != 0) {
    BVar3 = IR::Instr::GetBailOutKind(_bailOutKindWithBits);
    BVar4 = IR::Instr::GetBailOutKind(_bailOutKindWithBits);
    BVar4 = BailOutInfo::WithLazyBailOut(BVar4);
    if (BVar3 != BVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x9bf,
                         "(!needsLazyBailOut || instr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(instr->GetBailOutKind()))"
                         ,
                         "The lazy bailout bit should be present at this point. We might have removed it incorrectly."
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  bailOutKindWithoutBits = IR::Instr::GetBailOutKind(_bailOutKindWithBits);
  BVar3 = IR::operator&(bailOutKindWithoutBits,BailOutMarkTempObject);
  if (BVar3 != BailOutInvalid) {
    BVar4 = IR::operator~(BailOutMarkTempObject);
    IR::operator&=(&bailOutKindWithoutBits,BVar4);
    IR::Instr::SetBailOutKind(_bailOutKindWithBits,bailOutKindWithoutBits);
  }
  if ((hasMarkTempObject & 1U) == 0) {
    IR::Instr::ClearLazyBailOut(_bailOutKindWithBits);
    bVar2 = IR::Instr::HasBailOutInfo(_bailOutKindWithBits);
    if (bVar2) {
      BVar4 = IR::Instr::GetBailOutKindNoBits(_bailOutKindWithBits);
      pBVar6 = IR::Instr::GetBailOutInfo(_bailOutKindWithBits);
      if ((pBVar6->canDeadStore & 1U) == 0) {
        if (BVar3 == BailOutInvalid) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x9ea,"(hasMarkTempObject)","hasMarkTempObject");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        if (BVar4 != BailOutOnImplicitCallsPreOp) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x9ec,"(bailOutKindWithoutBits == IR::BailOutOnImplicitCallsPreOp)",
                             "bailOutKindWithoutBits == IR::BailOutOnImplicitCallsPreOp");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        instr_local._7_1_ = true;
      }
      else {
        BVar3 = IR::operator-(bailOutKindWithoutBits,BVar4);
        if (BVar3 == BailOutInvalid) {
          instr_local._7_1_ = false;
        }
        else {
          IR::Instr::SetBailOutKind(_bailOutKindWithBits,BVar3);
          instr_local._7_1_ = true;
        }
      }
    }
    else {
      instr_local._7_1_ = true;
    }
  }
  else {
    if ((local_1a & 1) != 0) {
      bVar2 = IR::Instr::CanChangeFieldValueWithoutImplicitCall(_bailOutKindWithBits);
      if (!bVar2) {
        IR::Instr::ClearLazyBailOut(_bailOutKindWithBits);
      }
    }
    instr_local._7_1_ = true;
  }
  return instr_local._7_1_;
}

Assistant:

bool
BackwardPass::UpdateImplicitCallBailOutKind(IR::Instr* const instr, bool needsBailOutOnImplicitCall, bool needsLazyBailOut)
{
    Assert(instr);
    Assert(instr->HasBailOutInfo());
    Assert(BailOutInfo::IsBailOutOnImplicitCalls(instr->GetBailOutKind()));
    AssertMsg(
        needsLazyBailOut || instr->GetBailOutKind() == BailOutInfo::WithoutLazyBailOut(instr->GetBailOutKind()),
        "We should have removed all lazy bailout bit at this point if we decided that we wouldn't need it"
    );
    AssertMsg(
        !needsLazyBailOut || instr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(instr->GetBailOutKind()),
        "The lazy bailout bit should be present at this point. We might have removed it incorrectly."
    );

    IR::BailOutKind bailOutKindWithBits = instr->GetBailOutKind();

    const bool hasMarkTempObject = bailOutKindWithBits & IR::BailOutMarkTempObject;

    // Firstly, we remove the mark temp object bit, as it is not needed after the dead store pass.
    // We will later skip removing BailOutOnImplicitCalls when there is a mark temp object bit regardless
    // of `needsBailOutOnImplicitCall`.
    if (hasMarkTempObject)
    {
        bailOutKindWithBits &= ~IR::BailOutMarkTempObject;
        instr->SetBailOutKind(bailOutKindWithBits);
    }

    if (needsBailOutOnImplicitCall)
    {
        // We decided that BailOutOnImplicitCall is needed. So lazy bailout is unnecessary
        // because we are already protected from potential side effects unless the operation
        // itself can change fields' values (StFld/StElem).
        if (needsLazyBailOut && !instr->CanChangeFieldValueWithoutImplicitCall())
        {
            instr->ClearLazyBailOut();
        }

        return true;
    }
    else
    {
        // `needsBailOutOnImplicitCall` also captures our intention to keep BailOutOnImplicitCalls
        // because we want to do fixed field lazy bailout optimization. So if we don't need them,
        // just remove our lazy bailout.
        instr->ClearLazyBailOut();
        if (!instr->HasBailOutInfo())
        {
            return true;
        }
    }

    const IR::BailOutKind bailOutKindWithoutBits = instr->GetBailOutKindNoBits();
    if (!instr->GetBailOutInfo()->canDeadStore)
    {
        // revisit if canDeadStore is used for anything other than BailOutMarkTempObject
        Assert(hasMarkTempObject);
        // Don't remove the implicit call pre op bailout for mark temp object.
        Assert(bailOutKindWithoutBits == IR::BailOutOnImplicitCallsPreOp);
        return true;
    }

    // At this point, we don't need the bail on implicit calls.
    // Simply use the bailout kind bits as our new bailout kind.
    IR::BailOutKind newBailOutKind = bailOutKindWithBits - bailOutKindWithoutBits;

    if (newBailOutKind == IR::BailOutInvalid)
    {
        return false;
    }

    instr->SetBailOutKind(newBailOutKind);
    return true;
}